

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-view.cc
# Opt level: O3

int __thiscall
wabt::string_view::compare(string_view *this,size_type pos1,size_type n1,char *s,size_type n2)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  size_type __n;
  
  uVar3 = this->size_ - pos1;
  if (this->size_ < pos1) {
    __assert_fail("pos <= size_",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/string-view.cc"
                  ,0x3e,"string_view wabt::string_view::substr(size_type, size_type) const");
  }
  if (uVar3 < n1) {
    n1 = uVar3;
  }
  __n = n2;
  if (n1 < n2) {
    __n = n1;
  }
  if ((__n != 0) && (iVar1 = memcmp(this->data_ + pos1,s,__n), iVar1 != 0)) {
    return iVar1;
  }
  uVar2 = 0;
  if (n1 != n2) {
    uVar2 = -(uint)(n1 < n2) | 1;
  }
  return uVar2;
}

Assistant:

string_view string_view::substr(size_type pos, size_type n) const {
  assert(pos <= size_);
  size_t count = std::min(n, size_ - pos);
  return string_view(data_ + pos, count);
}